

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_resampler.cc
# Opt level: O2

void __thiscall webrtc::PushResampler<short>::~PushResampler(PushResampler<short> *this)

{
  ~PushResampler(this);
  operator_delete(this);
  return;
}

Assistant:

PushResampler<T>::~PushResampler() {
}